

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QGraphicsAnchorLayoutPrivate::setItemsGeometries(QGraphicsAnchorLayoutPrivate *this,QRectF *geom)

{
  QGraphicsLayoutItem *pQVar1;
  long lVar2;
  QGraphicsLayoutItem **ppQVar3;
  Data *pDVar4;
  Data *pDVar5;
  LayoutDirection LVar6;
  Node<QGraphicsLayoutItem_*,_QHashDummyValue> *pNVar7;
  AnchorVertex *pAVar8;
  Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *pNVar9;
  long lVar10;
  AnchorVertex *pAVar11;
  long in_FS_OFFSET;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  QSizeF QVar15;
  QGraphicsLayoutItem *item;
  qreal right;
  qreal left;
  qreal top;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  QGraphicsLayoutItem *local_68;
  double local_60;
  double local_58;
  double local_50;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  local_50 = -NAN;
  local_58 = -NAN;
  local_60 = -NAN;
  (*pQVar1->_vptr_QGraphicsLayoutItem[3])(pQVar1,&local_58,&local_50,&local_60,0);
  LVar6 = QGraphicsLayoutPrivate::visualDirection(&this->super_QGraphicsLayoutPrivate);
  if (LVar6 == RightToLeft) {
    uVar12 = SUB84(local_58,0);
    uVar13 = (undefined4)((ulong)local_58 >> 0x20);
    local_58 = local_60;
  }
  else {
    uVar12 = SUB84(local_60,0);
    uVar13 = (undefined4)((ulong)local_60 >> 0x20);
  }
  local_58 = local_58 + geom->xp;
  local_50 = geom->yp + local_50;
  local_60 = (geom->xp + geom->w) - (double)CONCAT44(uVar13,uVar12);
  lVar2 = (this->items).d.size;
  if (lVar2 != 0) {
    ppQVar3 = (this->items).d.ptr;
    lVar10 = 0;
    do {
      local_68 = *(QGraphicsLayoutItem **)((long)ppQVar3 + lVar10);
      local_78 = 0.0;
      dStack_70 = 0.0;
      local_88 = 0.0;
      dStack_80 = 0.0;
      local_48.first = (QGraphicsLayoutItem *)0xbff0000000000000;
      local_48._8_8_ = 0xbff0000000000000;
      QVar15 = QGraphicsLayoutItem::effectiveSizeHint(local_68,PreferredSize,(QSizeF *)&local_48);
      pDVar4 = (this->m_floatItems).m_data[0].q_hash.d;
      if (pDVar4 == (Data *)0x0) {
LAB_005c2fff:
        local_48.first = local_68;
        local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
        pDVar5 = (this->m_vertexList).d;
        if (pDVar5 == (Data *)0x0) {
          pAVar11 = (AnchorVertex *)0x0;
LAB_005c3069:
          pAVar8 = (AnchorVertex *)0x0;
        }
        else {
          pNVar9 = QHashPrivate::
                   Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                   ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                             ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                               *)pDVar5,&local_48);
          if (pNVar9 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                         *)0x0) {
            pAVar11 = (AnchorVertex *)0x0;
          }
          else {
            pAVar11 = (pNVar9->value).first;
          }
          pDVar5 = (this->m_vertexList).d;
          local_48.first = local_68;
          local_48.second = 2;
          if (pDVar5 == (Data *)0x0) goto LAB_005c3069;
          pNVar9 = QHashPrivate::
                   Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                   ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                             ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                               *)pDVar5,&local_48);
          if (pNVar9 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                         *)0x0) goto LAB_005c3069;
          pAVar8 = (pNVar9->value).first;
        }
        if (LVar6 == LeftToRight) {
          local_88 = ((pAVar11->distance + local_58) - local_88) + local_88;
          dVar14 = local_58 + pAVar8->distance;
        }
        else {
          local_88 = ((local_60 - pAVar8->distance) - local_88) + local_88;
          dVar14 = local_60 - pAVar11->distance;
        }
      }
      else {
        dVar14 = QVar15.wd;
        pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>>::
                 findNode<QGraphicsLayoutItem*>
                           ((Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>> *)pDVar4
                            ,&local_68);
        if (pNVar7 == (Node<QGraphicsLayoutItem_*,_QHashDummyValue> *)0x0) goto LAB_005c2fff;
        local_88 = (0.0 - local_88) + local_88;
      }
      local_78 = dVar14 - local_88;
      pDVar4 = (this->m_floatItems).m_data[1].q_hash.d;
      if (pDVar4 == (Data *)0x0) {
LAB_005c3112:
        local_48.first = local_68;
        local_48.second = AnchorTop;
        pDVar5 = (this->m_vertexList).d;
        if (pDVar5 == (Data *)0x0) {
LAB_005c3143:
          pAVar11 = (AnchorVertex *)0x0;
        }
        else {
          pNVar9 = QHashPrivate::
                   Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                   ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                             ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                               *)pDVar5,&local_48);
          if (pNVar9 == (Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                         *)0x0) goto LAB_005c3143;
          pAVar11 = (pNVar9->value).first;
        }
        local_48.first = local_68;
        local_48.second = 5;
        pNVar9 = QHashPrivate::
                 Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                 ::findNode<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
                           ((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
                             *)(this->m_vertexList).d,&local_48);
        dStack_80 = ((pAVar11->distance + local_50) - dStack_80) + dStack_80;
        dStack_70 = (local_50 + ((pNVar9->value).first)->distance) - dStack_80;
      }
      else {
        pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>>::
                 findNode<QGraphicsLayoutItem*>
                           ((Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>> *)pDVar4
                            ,&local_68);
        if (pNVar7 == (Node<QGraphicsLayoutItem_*,_QHashDummyValue> *)0x0) goto LAB_005c3112;
        dStack_80 = (0.0 - dStack_80) + dStack_80;
        dStack_70 = QVar15.ht - dStack_80;
      }
      (*local_68->_vptr_QGraphicsLayoutItem[2])(local_68,&local_88);
      lVar10 = lVar10 + 8;
    } while (lVar2 << 3 != lVar10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::setItemsGeometries(const QRectF &geom)
{
    Q_Q(QGraphicsAnchorLayout);
    AnchorVertex *firstH, *secondH, *firstV, *secondV;

    qreal top;
    qreal left;
    qreal right;

    q->getContentsMargins(&left, &top, &right, nullptr);
    const Qt::LayoutDirection visualDir = visualDirection();
    if (visualDir == Qt::RightToLeft)
        qSwap(left, right);

    left += geom.left();
    top += geom.top();
    right = geom.right() - right;

    for (QGraphicsLayoutItem *item : std::as_const(items)) {
        QRectF newGeom;
        QSizeF itemPreferredSize = item->effectiveSizeHint(Qt::PreferredSize);
        if (m_floatItems[Qt::Horizontal].contains(item)) {
            newGeom.setLeft(0);
            newGeom.setRight(itemPreferredSize.width());
        } else {
            firstH = internalVertex(item, Qt::AnchorLeft);
            secondH = internalVertex(item, Qt::AnchorRight);

            if (visualDir == Qt::LeftToRight) {
                newGeom.setLeft(left + firstH->distance);
                newGeom.setRight(left + secondH->distance);
            } else {
                newGeom.setLeft(right - secondH->distance);
                newGeom.setRight(right - firstH->distance);
            }
        }

        if (m_floatItems[Qt::Vertical].contains(item)) {
            newGeom.setTop(0);
            newGeom.setBottom(itemPreferredSize.height());
        } else {
            firstV = internalVertex(item, Qt::AnchorTop);
            secondV = internalVertex(item, Qt::AnchorBottom);

            newGeom.setTop(top + firstV->distance);
            newGeom.setBottom(top + secondV->distance);
        }

        item->setGeometry(newGeom);
    }
}